

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_sequence_adapter.hpp
# Opt level: O0

void __thiscall
asio::detail::
buffer_sequence_adapter<asio::const_buffer,asio::detail::prepared_buffers<asio::const_buffer,64ul>>
::init<asio::const_buffer_const*>
          (buffer_sequence_adapter<asio::const_buffer,_asio::detail::prepared_buffers<asio::const_buffer,_64UL>_>
           *this,const_buffer *begin,const_buffer *end)

{
  size_t sVar1;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  const_buffer buffer;
  const_buffer *iter;
  const_buffer *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  bool bVar2;
  const_buffer local_30;
  undefined8 *local_20;
  undefined8 *local_18;
  
  local_20 = in_RSI;
  local_18 = in_RDX;
  while( true ) {
    bVar2 = false;
    if (local_20 != local_18) {
      bVar2 = *(ulong *)(in_RDI + 0x400) < 0x40;
    }
    if (bVar2 == false) break;
    local_30.data_ = (void *)*local_20;
    local_30.size_ = local_20[1];
    buffer_sequence_adapter_base::init_native_buffer
              ((iovec *)CONCAT17(bVar2,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8);
    sVar1 = const_buffer::size(&local_30);
    *(size_t *)(in_RDI + 0x408) = sVar1 + *(long *)(in_RDI + 0x408);
    local_20 = local_20 + 2;
    *(long *)(in_RDI + 0x400) = *(long *)(in_RDI + 0x400) + 1;
  }
  return;
}

Assistant:

void init(Iterator begin, Iterator end)
  {
    Iterator iter = begin;
    for (; iter != end && count_ < max_buffers; ++iter, ++count_)
    {
      Buffer buffer(*iter);
      init_native_buffer(buffers_[count_], buffer);
      total_buffer_size_ += buffer.size();
    }
  }